

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

uint32_t __thiscall kratos::Var::width(Var *this)

{
  bool bVar1;
  uint64_t uVar2;
  reference puVar3;
  uint32_t local_48;
  uint *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  uint32_t w;
  Var *this_local;
  
  if ((this->width_param_ == (Var *)0x0) || (this->type_ == Slice)) {
    local_48 = this->var_width_;
  }
  else {
    uVar2 = Simulator::static_evaluate_expr(this->width_param_);
    local_48 = (uint32_t)uVar2;
  }
  __range1._4_4_ = local_48;
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->size_);
  i = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->size_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&i);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    __range1._4_4_ = *puVar3 * __range1._4_4_;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

uint32_t Var::width() const {
    uint32_t w = (width_param_ && type_ != VarType::Slice)
                     ? Simulator::static_evaluate_expr(width_param_)
                     : var_width_;
    for (auto const &i : size_) w *= i;
    return w;
}